

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_robust_pattern(fdb_config fconfig)

{
  long lVar1;
  long lVar2;
  storage_t *psVar3;
  fdb_kvs_handle *pfVar4;
  undefined7 in_stack_ffffffffffffd258;
  undefined1 in_stack_ffffffffffffd25f;
  checkpoint_t *in_stack_ffffffffffffd260;
  idx_prams_t *in_stack_ffffffffffffd268;
  fdb_kvs_config *in_stack_ffffffffffffd270;
  fdb_config *in_stack_ffffffffffffd278;
  fdb_config *in_stack_ffffffffffffd280;
  undefined1 in_stack_ffffffffffffd2af;
  fdb_file_handle *in_stack_ffffffffffffd2b0;
  fdb_kvs_handle *in_stack_ffffffffffffd2e8;
  storage_t *in_stack_ffffffffffffd2f0;
  void *apvStack_2d08 [10];
  pthread_t apStack_2cb8 [10];
  void *apvStack_2c68 [9];
  undefined8 uStack_2c20;
  undefined1 auStack_2c18 [7];
  undefined1 in_stack_ffffffffffffd3ef;
  storage_t *in_stack_ffffffffffffd3f0;
  undefined1 auStack_2b28 [2968];
  storage_t *in_stack_ffffffffffffe070;
  long alStack_148 [10];
  long local_f8 [10];
  undefined1 *local_a8;
  int local_9c;
  int n;
  void *i_ret;
  void *c_ret;
  pthread_t i_tid;
  pthread_t c_tid;
  fdb_kvs_handle **scan_kv;
  void **thread_ret_wr;
  pthread_t *tid_wr;
  void **thread_ret_sc;
  pthread_t *tid_sc;
  fdb_kvs_config kvs_config;
  idx_prams_t *index_params;
  checkpoint_t *verification_checkpoint;
  storage_t **st2;
  storage_t **st;
  int n_scanners;
  int n_writers;
  int i;
  
  local_a8 = &stack0x00000008;
  kvs_config.custom_cmp_param = auStack_2c18;
  uStack_2c20 = 0x1060f0;
  fdb_get_default_kvs_config();
  thread_ret_sc = apvStack_2c68;
  tid_wr = apStack_2cb8;
  thread_ret_wr = apvStack_2d08;
  scan_kv = (fdb_kvs_handle **)&stack0xffffffffffffd2a8;
  c_tid = (pthread_t)&stack0xffffffffffffd258;
  memleak_start();
  rm_storage_fs();
  for (n_scanners = 0; n_scanners < 10; n_scanners = n_scanners + 1) {
    gen_index_params((idx_prams_t *)in_stack_ffffffffffffd2b0);
    memset(auStack_2b28 + (long)n_scanners * 0x430,0,0x430);
    psVar3 = init_storage(in_stack_ffffffffffffd280,in_stack_ffffffffffffd278,
                          in_stack_ffffffffffffd270,in_stack_ffffffffffffd268,
                          in_stack_ffffffffffffd260,(bool)in_stack_ffffffffffffd25f);
    local_f8[n_scanners] = (long)psVar3;
    psVar3 = init_storage(in_stack_ffffffffffffd280,in_stack_ffffffffffffd278,
                          in_stack_ffffffffffffd270,in_stack_ffffffffffffd268,
                          in_stack_ffffffffffffd260,(bool)in_stack_ffffffffffffd25f);
    alStack_148[n_scanners] = (long)psVar3;
    lVar1 = alStack_148[n_scanners];
    lVar2 = local_f8[n_scanners];
    *(undefined4 *)(lVar1 + 0x48) = *(undefined4 *)(lVar2 + 0x48);
    *(undefined2 *)(lVar1 + 0x4c) = *(undefined2 *)(lVar2 + 0x4c);
  }
  for (n_scanners = 0; n_scanners < 100; n_scanners = n_scanners + 1) {
    load_persons(in_stack_ffffffffffffe070);
  }
  pthread_create(&i_tid,(pthread_attr_t *)0x0,compact_thread,local_a8);
  pthread_create((pthread_t *)&c_ret,(pthread_attr_t *)0x0,iterate_thread,local_a8);
  for (local_9c = 0; local_9c < 10; local_9c = local_9c + 1) {
    for (n_scanners = 0; n_scanners < 9; n_scanners = n_scanners + 1) {
      *(undefined1 *)(local_f8[n_scanners] + 0x4f) = 0;
      pthread_create((pthread_t *)(thread_ret_wr + n_scanners),(pthread_attr_t *)0x0,writer_thread,
                     (void *)local_f8[n_scanners]);
    }
    for (n_scanners = 0; n_scanners < 10; n_scanners = n_scanners + 1) {
      pfVar4 = scan(in_stack_ffffffffffffd2f0,in_stack_ffffffffffffd2e8);
      *(fdb_kvs_handle **)(c_tid + (long)n_scanners * 8) = pfVar4;
      pthread_create((pthread_t *)(thread_ret_sc + n_scanners),(pthread_attr_t *)0x0,scan_thread,
                     *(void **)(c_tid + (long)n_scanners * 8));
    }
    e2e_fdb_commit(in_stack_ffffffffffffd2b0,(bool)in_stack_ffffffffffffd2af);
    for (n_scanners = 0; n_scanners < 10; n_scanners = n_scanners + 1) {
      pthread_join((pthread_t)thread_ret_sc[n_scanners],(void **)(tid_wr + n_scanners));
      fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_ffffffffffffd25f,in_stack_ffffffffffffd258))
      ;
    }
    for (n_scanners = 0; n_scanners < 9; n_scanners = n_scanners + 1) {
      pthread_join((pthread_t)thread_ret_wr[n_scanners],scan_kv + n_scanners);
      update_index(in_stack_ffffffffffffd3f0,(bool)in_stack_ffffffffffffd3ef);
    }
    e2e_fdb_commit(in_stack_ffffffffffffd2b0,(bool)in_stack_ffffffffffffd2af);
  }
  pthread_join(i_tid,&i_ret);
  pthread_join((pthread_t)c_ret,(void **)&stack0xffffffffffffff68);
  for (n_scanners = 0; n_scanners < 10; n_scanners = n_scanners + 1) {
    e2e_fdb_close((storage_t *)0x1064f4);
    e2e_fdb_close((storage_t *)0x106505);
  }
  fdb_shutdown();
  memleak_end();
  return;
}

Assistant:

void e2e_robust_pattern(fdb_config fconfig) {

    int i;
    int n_writers = 10;
    int n_scanners = 10;
    storage_t **st = alca(storage_t *, n_writers);
    storage_t **st2 = alca(storage_t *, n_writers);
    checkpoint_t *verification_checkpoint = alca(checkpoint_t, n_writers);
    idx_prams_t *index_params = alca(idx_prams_t, n_writers);
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    thread_t *tid_sc = alca(thread_t, n_scanners);
    void **thread_ret_sc = alca(void *, n_scanners);
    thread_t *tid_wr = alca(thread_t, n_writers);
    void **thread_ret_wr = alca(void *, n_writers);
    fdb_kvs_handle **scan_kv = alca(fdb_kvs_handle *, n_scanners);
    thread_t c_tid, i_tid;
    void *c_ret, *i_ret;

    memleak_start();

    // init
    rm_storage_fs();

    // init storage handles
    // the nth writer is commit handler
    for (i = 0;i < n_writers; ++i) {
        gen_index_params(&index_params[i]);
        memset(&verification_checkpoint[i], 0, sizeof(checkpoint_t));
        st[i] = init_storage(&fconfig, &fconfig, &kvs_config,
                &index_params[i], &verification_checkpoint[i], true);
        st2[i] = init_storage(&fconfig, &fconfig, &kvs_config,
                &index_params[i], &verification_checkpoint[i], true);
        memcpy(st2[i]->keyspace, st[i]->keyspace, KEYSPACE_LEN);
    }

    // load init data
    for (i = 0; i < 100; ++i) {
        load_persons(st[0]);
    }

    thread_create(&c_tid, compact_thread, (void*)&fconfig);
    thread_create(&i_tid, iterate_thread, (void*)&fconfig);

    for (int n = 0; n < 10; ++n) {
        // start writer threads
        for (i = 0; i < n_writers - 1; ++i) {
            st[i]->verify_set = false;
            thread_create(&tid_wr[i], writer_thread, (void*)st[i]);
        }


        // start scanner threads
        for (i = 0; i < n_scanners; ++i) {
            scan_kv[i] = scan(st2[i], NULL);
            thread_create(&tid_sc[i], scan_thread, (void*)scan_kv[i]);
        }

        e2e_fdb_commit(st[n_writers-1]->main, true);

        // join scan threads
        for (i = 0; i < n_scanners; ++i) {
            thread_join(tid_sc[i], &thread_ret_sc[i]);
            fdb_kvs_close(scan_kv[i]);
        }

        // join writer threads
        for (i = 0; i < n_writers - 1; ++i) {
            thread_join(tid_wr[i], &thread_ret_wr[i]);
            update_index(st[i], false);
        }
        e2e_fdb_commit(st[n_writers - 1]->main, false);
    }

    thread_join(c_tid, &c_ret);
    thread_join(i_tid, &i_ret);

    for (i = 0; i < n_writers; ++i) {
        // teardown
        e2e_fdb_close(st2[i]);
        e2e_fdb_close(st[i]);
    }
    fdb_shutdown();

    memleak_end();
}